

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_clear(void)

{
  initializer_list<int> input;
  int array [4];
  circular_view<int,_4UL> span;
  undefined4 local_6c;
  size_type local_68 [2];
  type local_58 [4];
  circular_view<int,_4UL> local_48;
  
  local_48.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_68[0] = 0x160000000b;
  local_68[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_68;
  vista::circular_view<int,_4UL>::assign(&local_48,input);
  local_68[0] = local_48.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x39d,"void api_fixed_suite::fixed_clear()",local_68,&local_6c);
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_68[0] = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x39f,"void api_fixed_suite::fixed_clear()",local_68,&local_6c);
  return;
}

Assistant:

void fixed_clear()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.clear();
    BOOST_TEST_EQ(span.size(), 0);
}